

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O2

bool iDynTree::vectorToString<iDynTree::Position>(Position *in,string *out_str)

{
  bool bVar1;
  long lVar2;
  string bufStr;
  stringstream ss;
  double local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = true;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      local_1e0 = *(double *)(in + lVar2 * 8);
      bVar1 = doubleToStringWithClassicLocale(&local_1e0,&local_1d8);
    }
    if (lVar2 != 0) {
      std::operator<<(local_1a8," ");
    }
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_str,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return bVar1;
}

Assistant:

bool inline vectorToString(const iDynTreeVectorType & in, std::string & out_str)
{
    std::stringstream ss;
    bool ok = true;
    for (unsigned int i = 0; i < in.size(); ++i)
    {
        std::string bufStr;
        ok = ok && doubleToStringWithClassicLocale(in(i), bufStr);
        if (i != 0)
        {
            ss << " ";
        }
        ss << bufStr;
    }

    out_str = ss.str();

    return ok;
}